

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

void stack_init(lua_State *L1,lua_State *L)

{
  uint uVar1;
  undefined4 *puVar2;
  void *in_RSI;
  lua_State *in_RDI;
  TValue *st;
  TValue *stend;
  undefined4 *local_58;
  undefined8 in_stack_ffffffffffffffb0;
  
  puVar2 = (undefined4 *)
           lj_mem_realloc(in_RDI,in_RSI,(MSize)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                          (MSize)in_stack_ffffffffffffffb0);
  (in_RDI->stack).ptr32 = (uint32_t)puVar2;
  in_RDI->stacksize = 0x2d;
  uVar1 = in_RDI->stacksize;
  (in_RDI->maxstack).ptr32 = (int)(puVar2 + (ulong)uVar1 * 2) - 0x30;
  in_RDI->top = (TValue *)(puVar2 + 2);
  in_RDI->base = (TValue *)(puVar2 + 2);
  *puVar2 = (int)in_RDI;
  puVar2[1] = 0xfffffff9;
  local_58 = puVar2;
  while (local_58 < puVar2 + (ulong)uVar1 * 2) {
    local_58[1] = 0xffffffff;
    local_58 = local_58 + 2;
  }
  return;
}

Assistant:

static void stack_init(lua_State *L1, lua_State *L)
{
  TValue *stend, *st = lj_mem_newvec(L, LJ_STACK_START+LJ_STACK_EXTRA, TValue);
  setmref(L1->stack, st);
  L1->stacksize = LJ_STACK_START + LJ_STACK_EXTRA;
  stend = st + L1->stacksize;
  setmref(L1->maxstack, stend - LJ_STACK_EXTRA - 1);
  L1->base = L1->top = st+1;
  setthreadV(L1, st, L1);  /* Needed for curr_funcisL() on empty stack. */
  while (st < stend)  /* Clear new slots. */
    setnilV(st++);
}